

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::TextbookBoyerMoore<char16_t>::Match<4u,1u>
          (TextbookBoyerMoore<char16_t> *this,Char *input,CharCount inputLength,
          CharCount *inputOffset,Char *pat,CharCount patLen,RegexStats *stats)

{
  code *pcVar1;
  int32 iVar2;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  int **ppiVar7;
  int local_84;
  int32 e;
  uint inputChar_1;
  int32 j;
  int lastOcc;
  uint inputChar;
  CharCount lastPatCharIndex;
  LastOccMap *localLastOccurrence;
  int32 *localGoodSuffix;
  uint local_40;
  CharCount endOffset;
  CharCount offset;
  CharCount patLen_local;
  Char *pat_local;
  CharCount *inputOffset_local;
  Char *pCStack_20;
  CharCount inputLength_local;
  Char *input_local;
  TextbookBoyerMoore<char16_t> *this_local;
  
  endOffset = patLen;
  _offset = pat;
  pat_local = (Char *)inputOffset;
  inputOffset_local._4_4_ = inputLength;
  pCStack_20 = input;
  input_local = (Char *)this;
  if (input == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xb9,"(input != 0)","input != 0");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (inputOffset_local._4_4_ < *(uint *)pat_local) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xba,"(inputOffset <= inputLength)","inputOffset <= inputLength");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (endOffset <= inputOffset_local._4_4_) {
    local_40 = *(uint *)pat_local;
    localGoodSuffix._4_4_ = inputOffset_local._4_4_ - (endOffset - 1);
    ppiVar7 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->goodSuffix);
    localLastOccurrence = (LastOccMap *)*ppiVar7;
    _inputChar = &this->lastOccurrence;
    lastOcc = endOffset - 1;
    for (; local_40 < localGoodSuffix._4_4_; local_40 = local_84 + local_40) {
      while( true ) {
        j = Chars<char16_t>::CTU(pCStack_20[local_40 + lastOcc]);
        bVar3 = MatchPatternAt<4u,1u>(j,_offset,lastOcc);
        iVar2 = j;
        if (bVar3) break;
        uVar4 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetDirectMapSize(_inputChar)
        ;
        if ((uint)iVar2 < uVar4) {
          BVar5 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                            (_inputChar,j);
          if (BVar5 == 0) {
            local_40 = endOffset + local_40;
            if (localGoodSuffix._4_4_ <= local_40) {
              return false;
            }
          }
          else {
            inputChar_1 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                                    (_inputChar,j);
LAB_015f745e:
            if ((int)(lastOcc - inputChar_1) <
                *(int *)((long)&(localLastOccurrence->isInMap).data[0].word +
                        (ulong)(uint)lastOcc * 4)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                                 ,0xeb,
                                 "((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex])"
                                 ,
                                 "(int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]"
                                );
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 0;
            }
            local_40 = (lastOcc - inputChar_1) + local_40;
            if (localGoodSuffix._4_4_ <= local_40) {
              return false;
            }
          }
        }
        else {
          bVar3 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                            (_inputChar,j,(int *)&inputChar_1);
          if (bVar3) goto LAB_015f745e;
          local_40 = endOffset + local_40;
          if (localGoodSuffix._4_4_ <= local_40) {
            return false;
          }
        }
      }
      if (lastOcc == 0) {
        *(uint *)pat_local = local_40;
        return true;
      }
      e = lastOcc + -1;
      while( true ) {
        if (stats != (RegexStats *)0x0) {
          stats->numCompares = stats->numCompares + 1;
        }
        uVar4 = Chars<char16_t>::CTU(pCStack_20[local_40 + e]);
        bVar3 = MatchPatternAt<4u,4u>(uVar4,_offset,e);
        if (!bVar3) break;
        e = e + -1;
        if (e < 0) {
          *(uint *)pat_local = local_40;
          return true;
        }
      }
      local_84 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::Get(_inputChar,(Char)uVar4)
      ;
      local_84 = e - local_84;
      if (local_84 <= *(int *)((long)&(localLastOccurrence->isInMap).data[0].word + (long)e * 4)) {
        local_84 = *(int *)((long)&(localLastOccurrence->isInMap).data[0].word + (long)e * 4);
      }
    }
  }
  return false;
}

Assistant:

bool TextbookBoyerMoore<C>::Match
        ( const Char *const input
        , const CharCount inputLength
        , CharCount& inputOffset
        , const Char* pat
        , const CharCount patLen
#if ENABLE_REGEX_CONFIG_OPTIONS
        , RegexStats* stats
#endif
        ) const
    {

        Assert(input != 0);
        Assert(inputOffset <= inputLength);

        if (inputLength < patLen)
            return false;

        CharCount offset = inputOffset;

        const CharCount endOffset = inputLength - (patLen - 1);
        const int32* const localGoodSuffix = goodSuffix;
        const LastOccMap* const localLastOccurrence = &lastOccurrence;

        const CharCount lastPatCharIndex = (patLen - 1);

        while (offset < endOffset)
        {
            // A separate tight loop to find the last character
            while (true)
            {
                uint inputChar = Chars<Char>::CTU(input[offset + lastPatCharIndex]);
                if (MatchPatternAt<equivClassSize, lastPatCharEquivClass>(inputChar, pat, lastPatCharIndex))
                {
                    // Found a match. Break out of this loop and go to the match pattern loop
                    break;
                }
                // Negative case is more common,
                // Write the checks so that we have a super tight loop
                int lastOcc;
                if (inputChar < localLastOccurrence->GetDirectMapSize())
                {
                    if (!localLastOccurrence->IsInDirectMap(inputChar))
                    {
                        offset += patLen;
                        if (offset >= endOffset)
                        {
                            return false;
                        }
                        continue;
                    }
                    lastOcc = localLastOccurrence->GetDirectMap(inputChar);
                }
                else if (!localLastOccurrence->GetNonDirect(inputChar, lastOcc))
                {
                    offset += patLen;
                    if (offset >= endOffset)
                    {
                        return false;
                    }
                    continue;
                }
                Assert((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]);
                offset += lastPatCharIndex - lastOcc;
                if (offset >= endOffset)
                {
                    return false;
                }
            }

            // CONSIDER: we can remove this check if we stop using TextbookBoyerMoore for one char pattern
            if (lastPatCharIndex == 0)
            {
                inputOffset = offset;
                return true;
            }

            // Match the rest of the pattern
            int32 j = lastPatCharIndex - 1;
            while (true)
            {
#if ENABLE_REGEX_CONFIG_OPTIONS
                if (stats != 0)
                    stats->numCompares++;
#endif
                uint inputChar = Chars<Char>::CTU(input[offset + j]);
                if (!MatchPatternAt<equivClassSize, equivClassSize>(inputChar, pat, j))
                {
                    const int32 e = j - localLastOccurrence->Get((Char)inputChar);
                    offset += e > localGoodSuffix[j] ? e : localGoodSuffix[j];
                    break;
                }
                if (--j < 0)
                {
                    inputOffset = offset;
                    return true;
                }
            }
        }
        return false;
    }